

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageOperators::Run(AdvancedUsageOperators *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  int iVar2;
  bool bVar3;
  GLuint GVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  allocator<char> local_7a;
  allocator<char> local_79;
  int data [4];
  string local_50;
  
  bVar3 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(std430, binding = 0) buffer Buffer0 {\n  readonly int g_i0;\n  int g_o0;\n};\nlayout(std430, binding = 1) buffer Buffer1 {\n  int i0;\n} g_buffer1;\nuniform int g_values[] = int[](1, 2, 3, 4, 5, 6);\nvoid main() {\n  g_o0 += g_i0;\n  g_o0 <<= 1;\n  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;\n  g_o0 *= g_i0;\n  g_o0 = --g_o0 + g_values[g_i0];\n  g_o0++;\n  ++g_o0;\n  g_buffer1.i0 = 0xff2f;\n  g_o0 &= g_buffer1.i0;\n}"
               ,&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_7a);
    GVar4 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data,&local_50);
    this->m_program = GVar4;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)data);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar7 = -1;
    if (bVar3) {
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_storage_buffer);
      data[0] = 3;
      data[1] = 5;
      data[2] = 0;
      data[3] = 0;
      uVar6 = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data,0x88ea);
      data._0_8_ = data._0_8_ & 0xffffffff00000000;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,data,0x88ea);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x10,data);
      if (data[0] == 3) {
        if (data[1] == 0x25) {
          glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
          glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,data);
          iVar2 = data[0];
          if (data[0] != 0xff2f) {
            anon_unknown_0::Output
                      ("[Buffer1] Data at index %d is %d should be %d.\n",0,data._0_8_ & 0xffffffff,
                       0xff2f);
          }
          return -(ulong)(iVar2 != 0xff2f);
        }
        uVar5 = 0x25;
        uVar6 = 1;
        uVar1 = data[1];
      }
      else {
        uVar5 = 3;
        uVar1 = data[0];
      }
      anon_unknown_0::Output
                ("[Buffer0] Data at index %d is %d should be %d.\n",uVar6,(ulong)uVar1,uVar5);
    }
  }
  else {
    lVar7 = 0x10;
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) buffer Buffer0 {" NL "  readonly int g_i0;" NL "  int g_o0;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer1 {" NL "  int i0;" NL "} g_buffer1;" NL
			   "uniform int g_values[] = int[](1, 2, 3, 4, 5, 6);" NL "void main() {" NL "  g_o0 += g_i0;" NL
			   "  g_o0 <<= 1;" NL "  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;" NL "  g_o0 *= g_i0;" NL
			   "  g_o0 = --g_o0 + g_values[g_i0];" NL "  g_o0++;" NL "  ++g_o0;" NL "  g_buffer1.i0 = 0xff2f;" NL
			   "  g_o0 &= g_buffer1.i0;" NL "}";

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(2, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 3, 5 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[2] = { 3, 37 };
			int		  data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer0 */
		{
			const int ref_data[1] = { 0xff2f };
			int		  data[1];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}

		return NO_ERROR;
	}